

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteSmv.c
# Opt level: O0

int Io_WriteSmvOneNode(FILE *pFile,Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int nFanins;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteSmv.c"
                  ,0xce,"int Io_WriteSmvOneNode(FILE *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_NodeIsConst1(pNode);
    if (iVar1 == 0) {
      __assert_fail("Abc_NodeIsConst1(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteSmv.c"
                    ,0xd2,"int Io_WriteSmvOneNode(FILE *, Abc_Obj_t *)");
    }
    pAVar2 = Abc_ObjFanout0(pNode);
    pcVar3 = Abc_ObjName(pAVar2);
    pcVar3 = cleanUNSAFE(pcVar3);
    fprintf((FILE *)pFile,"    %s",pcVar3);
    fprintf((FILE *)pFile," := 1;\n");
  }
  else if (iVar1 == 1) {
    iVar1 = Abc_NodeIsBuf(pNode);
    if (iVar1 == 0) {
      pAVar2 = Abc_ObjFanout0(pNode);
      pcVar3 = Abc_ObjName(pAVar2);
      pcVar3 = cleanUNSAFE(pcVar3);
      fprintf((FILE *)pFile,"    %s := !",pcVar3);
      pAVar2 = Abc_ObjFanin0(pNode);
      pcVar3 = Abc_ObjName(pAVar2);
      pcVar3 = cleanUNSAFE(pcVar3);
      fprintf((FILE *)pFile,"%s;\n",pcVar3);
    }
    else {
      pAVar2 = Abc_ObjFanout0(pNode);
      pcVar3 = Abc_ObjName(pAVar2);
      pcVar3 = cleanUNSAFE(pcVar3);
      fprintf((FILE *)pFile,"    %s := ",pcVar3);
      pAVar2 = Abc_ObjFanin0(pNode);
      pcVar3 = Abc_ObjName(pAVar2);
      pcVar3 = cleanUNSAFE(pcVar3);
      fprintf((FILE *)pFile,"%s;\n",pcVar3);
    }
  }
  else {
    pAVar2 = Abc_ObjFanout0(pNode);
    pcVar3 = Abc_ObjName(pAVar2);
    pcVar3 = cleanUNSAFE(pcVar3);
    fprintf((FILE *)pFile,"    %s",pcVar3);
    pAVar2 = Abc_ObjFanin0(pNode);
    pcVar3 = Abc_ObjName(pAVar2);
    pcVar3 = cleanUNSAFE(pcVar3);
    fprintf((FILE *)pFile," := %s & ",pcVar3);
    pAVar2 = Abc_ObjFanin1(pNode);
    pcVar3 = Abc_ObjName(pAVar2);
    pcVar3 = cleanUNSAFE(pcVar3);
    fprintf((FILE *)pFile,"%s;\n",pcVar3);
  }
  return 1;
}

Assistant:

int Io_WriteSmvOneNode( FILE * pFile, Abc_Obj_t * pNode )
{
    int nFanins;

    assert( Abc_ObjIsNode(pNode) );
    nFanins = Abc_ObjFaninNum(pNode);
    if ( nFanins == 0 )
    {   // write the constant 1 node
        assert( Abc_NodeIsConst1(pNode) );
        fprintf( pFile, "    %s", cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(pNode)) ) );
        fprintf( pFile, " := 1;\n" );
    }
    else if ( nFanins == 1 )
    {   // write the interver/buffer
        if ( Abc_NodeIsBuf(pNode) )
        {
            fprintf( pFile, "    %s := ", cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(pNode))) );
            fprintf( pFile, "%s;\n",      cleanUNSAFE(Abc_ObjName(Abc_ObjFanin0(pNode))) );
        }
        else
        {
            fprintf( pFile, "    %s := !",  cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(pNode))) );
            fprintf( pFile, "%s;\n",       cleanUNSAFE(Abc_ObjName(Abc_ObjFanin0(pNode))) );
        }
    }
    else
    {   // write the AND gate
        fprintf( pFile, "    %s", cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(pNode))) );
        fprintf( pFile, " := %s & ", cleanUNSAFE(Abc_ObjName(Abc_ObjFanin0(pNode))) );
        fprintf( pFile, "%s;\n", cleanUNSAFE(Abc_ObjName(Abc_ObjFanin1(pNode))) );
    }
    return 1;
}